

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O3

void helper_vmsave_x86_64(CPUX86State *env,int aflag)

{
  CPUState *cs_00;
  uint uVar1;
  CPUX86State *__mptr;
  ulong uVar2;
  CPUState *cs;
  
  if ((env->hflags & 0x200000) != 0) {
    helper_vmsave_x86_64_cold_1();
  }
  uVar2 = env->regs[0] & 0xffffffff;
  if (aflag == 2) {
    uVar2 = env->regs[0];
  }
  cs_00 = (CPUState *)(env[-6].mtrr_var + 4);
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x440,env->segs[4].selector);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x448,env->segs[4].base);
  x86_stl_phys_x86_64(cs_00,uVar2 + 0x444,env->segs[4].limit);
  uVar1 = env->segs[4].flags;
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x442,uVar1 >> 0xc & 0xf00 | uVar1 >> 8 & 0xff);
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x450,env->segs[5].selector);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x458,env->segs[5].base);
  x86_stl_phys_x86_64(cs_00,uVar2 + 0x454,env->segs[5].limit);
  uVar1 = env->segs[5].flags;
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x452,uVar1 >> 0xc & 0xf00 | uVar1 >> 8 & 0xff);
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x490,(env->tr).selector);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x498,(env->tr).base);
  x86_stl_phys_x86_64(cs_00,uVar2 + 0x494,(env->tr).limit);
  uVar1 = (env->tr).flags;
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x492,uVar1 >> 0xc & 0xf00 | uVar1 >> 8 & 0xff);
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x470,(env->ldt).selector);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x478,(env->ldt).base);
  x86_stl_phys_x86_64(cs_00,uVar2 + 0x474,(env->ldt).limit);
  uVar1 = (env->ldt).flags;
  x86_stw_phys_x86_64(cs_00,uVar2 + 0x472,uVar1 >> 0xc & 0xf00 | uVar1 >> 8 & 0xff);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x620,env->kernelgsbase);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x608,env->lstar);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x610,env->cstar);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x618,env->fmask);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x600,env->star);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x628,(ulong)env->sysenter_cs);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x630,env->sysenter_esp);
  x86_stq_phys_x86_64(cs_00,uVar2 + 0x638,env->sysenter_eip);
  return;
}

Assistant:

void helper_vmsave(CPUX86State *env, int aflag)
{
    CPUState *cs = env_cpu(env);
    target_ulong addr;

    cpu_svm_check_intercept_param(env, SVM_EXIT_VMSAVE, 0, GETPC());

    if (aflag == 2) {
        addr = env->regs[R_EAX];
    } else {
        addr = (uint32_t)env->regs[R_EAX];
    }

    // qemu_log_mask(CPU_LOG_TB_IN_ASM, "vmsave! " TARGET_FMT_lx
    //               "\nFS: %016" PRIx64 " | " TARGET_FMT_lx "\n",
    //               addr, x86_ldq_phys(cs,
    //                              addr + offsetof(struct vmcb, save.fs.base)),
    //               env->segs[R_FS].base);

    svm_save_seg(env, addr + offsetof(struct vmcb, save.fs),
                 &env->segs[R_FS]);
    svm_save_seg(env, addr + offsetof(struct vmcb, save.gs),
                 &env->segs[R_GS]);
    svm_save_seg(env, addr + offsetof(struct vmcb, save.tr),
                 &env->tr);
    svm_save_seg(env, addr + offsetof(struct vmcb, save.ldtr),
                 &env->ldt);

#ifdef TARGET_X86_64
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.kernel_gs_base),
             env->kernelgsbase);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.lstar), env->lstar);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.cstar), env->cstar);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.sfmask), env->fmask);
#endif
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.star), env->star);
    x86_stq_phys(cs,
             addr + offsetof(struct vmcb, save.sysenter_cs), env->sysenter_cs);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.sysenter_esp),
             env->sysenter_esp);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.sysenter_eip),
             env->sysenter_eip);
}